

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

Node * prvTidyParseBody(TidyDocImpl *doc,Node *body,GetTokenMode mode)

{
  TidyTagId TVar1;
  uint uVar2;
  Lexer *pLVar3;
  TidyParserMemory *pTVar4;
  Dict *pDVar5;
  Dict *pDVar6;
  TidyParserMemory data;
  Bool BVar7;
  int iVar8;
  long lVar9;
  Node *node;
  Node **ppNVar10;
  TidyTagId id;
  uint vers;
  Node *pNVar11;
  undefined4 uVar12;
  GetTokenMode mode_00;
  bool bVar13;
  TidyParserMemory memory;
  int local_70;
  uint local_6c;
  undefined8 local_48;
  
  pLVar3 = doc->lexer;
  if (body == (Node *)0x0) {
    iVar8 = (doc->stack).top;
    lVar9 = (long)iVar8;
    if (-1 < lVar9) {
      pTVar4 = (doc->stack).content;
      body = pTVar4[lVar9].original_node;
      mode_00 = pTVar4[lVar9].mode;
      local_70 = pTVar4[lVar9].register_1;
      local_6c = pTVar4[lVar9].register_2;
      (doc->stack).top = iVar8 + -1;
      goto LAB_0013b8ab;
    }
    body = (Node *)0x0;
    local_70 = 0;
  }
  else {
    prvTidyBumpObject(doc,body->parent);
    local_70 = 1;
  }
  mode_00 = IgnoreWhitespace;
  local_6c = 0;
LAB_0013b8ab:
  node = prvTidyGetToken(doc,mode_00);
  do {
    if (node == (Node *)0x0) {
      return (Node *)0x0;
    }
    pDVar5 = node->tag;
    if ((pDVar5 == body->tag) && (node->type == StartTag)) goto LAB_0013b8f5;
    if ((pDVar5 != (Dict *)0x0) && (pDVar5->id == TidyTag_HTML)) {
      BVar7 = prvTidynodeIsElement(node);
      if ((BVar7 != no) || (pLVar3->seenEndHtml != no)) goto LAB_0013b8f5;
      pLVar3->seenEndHtml = yes;
      goto LAB_0013b90a;
    }
    if ((pLVar3->seenEndBody != no) && (node->type - StartTag < 3)) {
      prvTidyReport(doc,body,node,0x233);
    }
    pDVar5 = node->tag;
    if ((pDVar5 == body->tag) && (node->type == EndTag)) {
      body->closed = yes;
      TrimSpaces(doc,body);
      prvTidyFreeNode(doc,node);
      pLVar3->seenEndBody = yes;
      mode_00 = IgnoreWhitespace;
      if (((body->parent != (Node *)0x0) && (pDVar5 = body->parent->tag, pDVar5 != (Dict *)0x0)) &&
         (mode_00 = IgnoreWhitespace, pDVar5->id == TidyTag_NOFRAMES)) {
        return (Node *)0x0;
      }
    }
    else {
      if (pDVar5 != (Dict *)0x0) {
        if (pDVar5->id == TidyTag_NOFRAMES) {
          if (node->type != EndTag) {
            if (node->type != StartTag) goto LAB_0013b9de;
            node->parent = body;
            if (body == (Node *)0x0) {
              node->prev = (Node *)0x0;
LAB_0013be8d:
              if (body != (Node *)0x0) {
                ppNVar10 = &body->content;
                goto LAB_0013be96;
              }
            }
            else {
              pNVar11 = body->last;
              node->prev = pNVar11;
              if (pNVar11 == (Node *)0x0) goto LAB_0013be8d;
              ppNVar10 = &pNVar11->next;
LAB_0013be96:
              *ppNVar10 = node;
              if (body != (Node *)0x0) {
                body->last = node;
              }
            }
            local_48 = CONCAT44(local_70,mode_00);
LAB_0013bec5:
            data.original_node = body;
            data.identity = prvTidyParseBody;
            data.reentry_node = node;
            data.reentry_mode = IgnoreWhitespace;
            data.reentry_state = 0;
            data.mode = (undefined4)local_48;
            data.register_1 = local_48._4_4_;
            data.register_2 = local_6c;
            data._44_4_ = 0;
            prvTidypushMemory(doc,data);
            return node;
          }
          if (((body->parent == (Node *)0x0) || (pDVar6 = body->parent->tag, pDVar6 == (Dict *)0x0))
             || (pDVar6->id != TidyTag_NOFRAMES)) goto LAB_0013b9de;
        }
        else {
LAB_0013b9de:
          if (((pDVar5 == (Dict *)0x0) ||
              (((pDVar5->id != TidyTag_FRAME &&
                ((pDVar5 == (Dict *)0x0 || (pDVar5->id != TidyTag_FRAMESET)))) ||
               (body->parent == (Node *)0x0)))) ||
             ((pDVar5 = body->parent->tag, pDVar5 == (Dict *)0x0 || (pDVar5->id != TidyTag_NOFRAMES)
              ))) goto LAB_0013ba0c;
        }
        TrimSpaces(doc,body);
LAB_0013be28:
        prvTidyUngetToken(doc);
        return (Node *)0x0;
      }
LAB_0013ba0c:
      BVar7 = prvTidynodeIsText(node);
      if (BVar7 == no) {
        bVar13 = false;
        local_6c = 0;
      }
      else {
        bVar13 = false;
        local_6c = 0;
        if (node->end <= node->start + 1) {
          bVar13 = pLVar3->lexbuf[node->start] == ' ';
          local_6c = (uint)bVar13;
        }
      }
      pNVar11 = node;
      BVar7 = InsertMisc(body,node);
      id = (TidyTagId)pNVar11;
      if (BVar7 != no) goto LAB_0013ba5b;
      BVar7 = prvTidynodeIsText(node);
      if (BVar7 != no) {
        if (!(bool)(bVar13 ^ 1) && mode_00 == IgnoreWhitespace) {
          prvTidyFreeNode(doc,node);
          local_6c = 1;
          mode_00 = IgnoreWhitespace;
          goto LAB_0013ba5b;
        }
        prvTidyConstrainVersion(doc,0xfffffeda);
        if ((local_70 == 0) || (iVar8 = prvTidyInlineDup(doc,node), iVar8 < 1)) {
          node->parent = body;
          if (body == (Node *)0x0) {
            node->prev = (Node *)0x0;
LAB_0013bb52:
            if (body != (Node *)0x0) {
              body->content = node;
LAB_0013bb5b:
              body->last = node;
            }
          }
          else {
            pNVar11 = body->last;
            node->prev = pNVar11;
            if (pNVar11 == (Node *)0x0) goto LAB_0013bb52;
            pNVar11->next = node;
            if (body != (Node *)0x0) goto LAB_0013bb5b;
          }
          local_70 = 0;
          mode_00 = MixedContent;
          goto LAB_0013ba5b;
        }
LAB_0013bdc7:
        local_70 = 0;
        goto LAB_0013ba5b;
      }
      if (node->type == DocTypeTag) {
        InsertDocType(doc,body,node);
        goto LAB_0013ba5b;
      }
      if ((node->tag == (Dict *)0x0) || (TVar1 = node->tag->id, TVar1 == TidyTag_PARAM))
      goto LAB_0013b8f5;
      pLVar3->excludeBlocks = no;
      if (TVar1 == TidyTag_INPUT) {
LAB_0013bb26:
        BVar7 = prvTidyIsHTML5Mode(doc);
        if (BVar7 != no) goto LAB_0013bb94;
LAB_0013bbab:
        if ((node->tag->model & 4) == 0) {
          pNVar11 = body;
          prvTidyReport(doc,body,node,0x27e);
          id = (TidyTagId)pNVar11;
        }
        pDVar5 = node->tag;
        uVar2 = pDVar5->model;
        if ((uVar2 & 2) == 0) {
          if ((uVar2 & 4) != 0) {
            MoveToHead(doc,body,node);
            goto LAB_0013ba5b;
          }
          if ((uVar2 & 0x20) == 0) {
            if ((uVar2 & 0x40) == 0) {
              if ((uVar2 & 0x380) == 0) {
                if ((pDVar5 == (Dict *)0x0) || (pDVar5->id != TidyTag_INPUT)) {
                  BVar7 = prvTidynodeHasCM(node,0x600);
                  if (BVar7 == no) goto LAB_0013be28;
                  goto LAB_0013b90a;
                }
                prvTidyUngetToken(doc);
                id = TidyTag_FORM;
              }
              else {
                if (node->type == EndTag) goto LAB_0013bcab;
                prvTidyUngetToken(doc);
                id = TidyTag_TABLE;
              }
            }
            else {
              prvTidyUngetToken(doc);
              id = TidyTag_DL;
            }
            node = prvTidyInferredTag(doc,id);
          }
          else {
            prvTidyUngetToken(doc);
            node = prvTidyInferredTag(doc,TidyTag_UL);
            pNVar11 = node;
            AddClassNoIndent(doc,node);
            id = (TidyTagId)pNVar11;
          }
LAB_0013bcab:
          pLVar3->excludeBlocks = yes;
          goto LAB_0013bcb2;
        }
        if ((((pDVar5 != (Dict *)0x0) && (pDVar5->id == TidyTag_BODY)) && (body->implicit != no)) &&
           (body->attributes == (AttVal *)0x0)) {
          body->attributes = node->attributes;
          node->attributes = (AttVal *)0x0;
        }
      }
      else {
        id = TidyTag_B;
        BVar7 = prvTidynodeHasCM(node,8);
        if (BVar7 == no) {
          id = TidyTag_BODY;
          BVar7 = prvTidynodeHasCM(node,0x10);
          if (BVar7 == no) goto LAB_0013bb26;
        }
LAB_0013bb94:
        if ((node->tag != (Dict *)0x0) && (node->tag->id == TidyTag_LI)) goto LAB_0013bbab;
LAB_0013bcb2:
        if (node->type == EndTag) {
          if ((node == (Node *)0x0) || (pDVar5 = node->tag, pDVar5 == (Dict *)0x0)) {
LAB_0013bcf7:
            id = TidyTag_BODY;
            BVar7 = prvTidynodeHasCM(node,0x10);
            if (BVar7 != no) {
              pNVar11 = node;
              prvTidyPopInline(doc,node);
              id = (TidyTagId)pNVar11;
            }
          }
          else if (pDVar5->id == TidyTag_BR) {
            node->type = StartTag;
          }
          else {
            if ((pDVar5 == (Dict *)0x0) || (pDVar5->id != TidyTag_P)) goto LAB_0013bcf7;
            node->type = StartEndTag;
            node->implicit = yes;
          }
        }
        BVar7 = prvTidynodeIsElement(node);
        if (BVar7 != no) {
          if (((node != (Node *)0x0) && (node->tag != (Dict *)0x0)) &&
             (node->tag->id == TidyTag_MAIN)) {
            if (doc == (TidyDocImpl *)0x0) {
              pNVar11 = (Node *)0x0;
            }
            else {
              pNVar11 = (doc->root).content;
            }
            BVar7 = findNodeWithId(pNVar11,id);
            if (BVar7 != no) {
              *(byte *)&doc->badForm = (byte)doc->badForm | 2;
              goto LAB_0013b8f5;
            }
          }
          BVar7 = prvTidynodeHasCM(node,0x10);
          if (BVar7 == no) {
            local_70 = 1;
            uVar12 = 0;
          }
          else {
            if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
               (vers = 0xfffffedb, node->tag->id != TidyTag_IMG)) {
              vers = 0xfffffeda;
            }
            prvTidyConstrainVersion(doc,vers);
            uVar12 = 1;
            if (local_70 != 0) {
              if (node->implicit != no) goto LAB_0013bf04;
              iVar8 = prvTidyInlineDup(doc,node);
              if (0 < iVar8) goto LAB_0013bdc7;
            }
            local_70 = 0;
          }
LAB_0013bf04:
          if (node->implicit != no) {
            prvTidyReport(doc,body,node,0x247);
          }
          node->parent = body;
          if (body == (Node *)0x0) {
            node->prev = (Node *)0x0;
LAB_0013bf57:
            if (body != (Node *)0x0) {
              ppNVar10 = &body->content;
              goto LAB_0013bf60;
            }
          }
          else {
            pNVar11 = body->last;
            node->prev = pNVar11;
            if (pNVar11 == (Node *)0x0) goto LAB_0013bf57;
            ppNVar10 = &pNVar11->next;
LAB_0013bf60:
            *ppNVar10 = node;
            if (body != (Node *)0x0) {
              body->last = node;
            }
          }
          local_48 = CONCAT44(local_70,uVar12);
          goto LAB_0013bec5;
        }
LAB_0013b8f5:
        prvTidyReport(doc,body,node,0x235);
      }
LAB_0013b90a:
      prvTidyFreeNode(doc,node);
    }
LAB_0013ba5b:
    node = prvTidyGetToken(doc,mode_00);
  } while( true );
}

Assistant:

Node* TY_(ParseBody)( TidyDocImpl* doc, Node *body, GetTokenMode mode )
{
    Lexer* lexer = doc->lexer;
    Node *node = NULL;
    Bool checkstack = no;
    Bool iswhitenode = no;
    DEBUG_LOG_COUNTERS;

    mode = IgnoreWhitespace;
    checkstack = yes;

    /*
     If we're re-entering, then we need to setup from a previous state,
     instead of starting fresh. We can pull what we need from the document's
     stack.
     */
    if ( body == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, as main loop overrwrites anyway. */
        DEBUG_LOG_REENTER_WITH_NODE(node);
        body = memory.original_node;
        checkstack = memory.register_1;
        iswhitenode = memory.register_2;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(body);
        TY_(BumpObject)( doc, body->parent );
    }
    
    while ((node = TY_(GetToken)(doc, mode)) != NULL)
    {
        DEBUG_LOG_GOT_TOKEN(node);
        /* find and discard multiple <body> elements */
        if (node->tag == body->tag && node->type == StartTag)
        {
            TY_(Report)(doc, body, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)(doc, node);
            continue;
        }

        /* #538536 Extra endtags not detected */
        if ( nodeIsHTML(node) )
        {
            if (TY_(nodeIsElement)(node) || lexer->seenEndHtml)
                TY_(Report)(doc, body, node, DISCARDING_UNEXPECTED);
            else
                lexer->seenEndHtml = 1;

            TY_(FreeNode)( doc, node);
            continue;
        }

        if ( lexer->seenEndBody &&
             ( node->type == StartTag ||
               node->type == EndTag   ||
               node->type == StartEndTag ) )
        {
            TY_(Report)(doc, body, node, CONTENT_AFTER_BODY );
        }

        if ( node->tag == body->tag && node->type == EndTag )
        {
            body->closed = yes;
            TrimSpaces(doc, body);
            TY_(FreeNode)( doc, node);
            lexer->seenEndBody = 1;
            DEBUG_LOG_GET_OLD_MODE;
            mode = IgnoreWhitespace;
            DEBUG_LOG_CHANGE_MODE;

            if ( nodeIsNOFRAMES(body->parent) )
                break;

            continue;
        }

        if ( nodeIsNOFRAMES(node) )
        {
            if (node->type == StartTag)
            {
                TidyParserMemory memory = {0};

                TY_(InsertNodeAtEnd)(body, node);
                
                memory.identity = TY_(ParseBody);
                memory.original_node = body;
                memory.reentry_node = node;
                memory.register_1 = checkstack;
                memory.register_2 = iswhitenode;
                memory.mode = mode;
                TY_(pushMemory)( doc, memory );
                DEBUG_LOG_EXIT_WITH_NODE(node);
                return node;
            }

            if (node->type == EndTag && nodeIsNOFRAMES(body->parent) )
            {
                TrimSpaces(doc, body);
                TY_(UngetToken)( doc );
                break;
            }
        }

        if ( (nodeIsFRAME(node) || nodeIsFRAMESET(node))
             && nodeIsNOFRAMES(body->parent) )
        {
            TrimSpaces(doc, body);
            TY_(UngetToken)( doc );
            break;
        }

        iswhitenode = no;

        if ( TY_(nodeIsText)(node) &&
             node->end <= node->start + 1 &&
             lexer->lexbuf[node->start] == ' ' )
            iswhitenode = yes;

        /* deal with comments etc. */
        if (InsertMisc(body, node))
            continue;

        /* mixed content model permits text */
        if (TY_(nodeIsText)(node))
        {
            if (iswhitenode && mode == IgnoreWhitespace)
            {
                TY_(FreeNode)( doc, node);
                continue;
            }

            /* HTML 2 and HTML4 strict don't allow text here */
            TY_(ConstrainVersion)(doc, ~(VERS_HTML40_STRICT | VERS_HTML20));

            if (checkstack)
            {
                checkstack = no;

                if ( TY_(InlineDup)(doc, node) > 0 )
                    continue;
            }

            TY_(InsertNodeAtEnd)(body, node);
            DEBUG_LOG_GET_OLD_MODE;
            mode = MixedContent;
            DEBUG_LOG_CHANGE_MODE;
            continue;
        }

        if (node->type == DocTypeTag)
        {
            InsertDocType(doc, body, node);
            continue;
        }
        /* discard unknown  and PARAM tags */
        if ( node->tag == NULL || nodeIsPARAM(node) )
        {
            TY_(Report)(doc, body, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /*
          Netscape allows LI and DD directly in BODY
          We infer UL or DL respectively and use this
          Bool to exclude block-level elements so as
          to match Netscape's observed behaviour.
        */
        lexer->excludeBlocks = no;

        if ((( nodeIsINPUT(node) ||
             (!TY_(nodeHasCM)(node, CM_BLOCK) && !TY_(nodeHasCM)(node, CM_INLINE))
           ) && !TY_(IsHTML5Mode)(doc)) || nodeIsLI(node) )
        {
            /* avoid this error message being issued twice */
            if (!(node->tag->model & CM_HEAD))
                TY_(Report)(doc, body, node, TAG_NOT_ALLOWED_IN);

            if (node->tag->model & CM_HTML)
            {
                /* copy body attributes if current body was inferred */
                if ( nodeIsBODY(node) && body->implicit
                     && body->attributes == NULL )
                {
                    body->attributes = node->attributes;
                    node->attributes = NULL;
                }

                TY_(FreeNode)( doc, node);
                continue;
            }

            if (node->tag->model & CM_HEAD)
            {
                MoveToHead(doc, body, node);
                continue;
            }

            if (node->tag->model & CM_LIST)
            {
                TY_(UngetToken)( doc );
                node = TY_(InferredTag)(doc, TidyTag_UL);
                AddClassNoIndent(doc, node);
                lexer->excludeBlocks = yes;
            }
            else if (node->tag->model & CM_DEFLIST)
            {
                TY_(UngetToken)( doc );
                node = TY_(InferredTag)(doc, TidyTag_DL);
                lexer->excludeBlocks = yes;
            }
            else if (node->tag->model & (CM_TABLE | CM_ROWGRP | CM_ROW))
            {
                /* http://tidy.sf.net/issue/2855621 */
                if (node->type != EndTag) {
                    TY_(UngetToken)( doc );
                    node = TY_(InferredTag)(doc, TidyTag_TABLE);
                }
                lexer->excludeBlocks = yes;
            }
            else if ( nodeIsINPUT(node) )
            {
                TY_(UngetToken)( doc );
                node = TY_(InferredTag)(doc, TidyTag_FORM);
                lexer->excludeBlocks = yes;
            }
            else
            {
                if ( !TY_(nodeHasCM)(node, CM_ROW | CM_FIELD) )
                {
                    TY_(UngetToken)( doc );
                    DEBUG_LOG_EXIT;
                    return NULL;
                }

                /* ignore </td> </th> <option> etc. */
                TY_(FreeNode)( doc, node );
                continue;
            }
        }

        if (node->type == EndTag)
        {
            if ( nodeIsBR(node) )
            {
                node->type = StartTag;
            }
            else if ( nodeIsP(node) )
            {
                node->type = StartEndTag;
                node->implicit = yes;
            }
            else if ( TY_(nodeHasCM)(node, CM_INLINE) )
                TY_(PopInline)( doc, node );
        }

        if (TY_(nodeIsElement)(node))
        {
            if (nodeIsMAIN(node))
            {
                /*\ Issue #166 - repeated <main> element
                 *  How to efficiently search for a previous main element?
                \*/
                if ( findNodeById(doc, TidyTag_MAIN) )
                {
                    doc->badForm |= flg_BadMain; /* this is an ERROR in format */
                    TY_(Report)(doc, body, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }
            }
            /* Issue #20 - merging from Ger Hobbelt fork put back CM_MIXED, which had been
               removed to fix this issue - reverting to fix 880221e
             */
            if ( TY_(nodeHasCM)(node, CM_INLINE) )
            {
                /* HTML4 strict doesn't allow inline content here */
                /* but HTML2 does allow img elements as children of body */
                if ( nodeIsIMG(node) )
                    TY_(ConstrainVersion)(doc, ~VERS_HTML40_STRICT);
                else
                    TY_(ConstrainVersion)(doc, ~(VERS_HTML40_STRICT|VERS_HTML20));

                if (checkstack && !node->implicit)
                {
                    checkstack = no;

                    if ( TY_(InlineDup)(doc, node) > 0 )
                        continue;
                }
                
                DEBUG_LOG_GET_OLD_MODE;
                mode = MixedContent;
                DEBUG_LOG_CHANGE_MODE;
            }
            else
            {
                checkstack = yes;
                DEBUG_LOG_GET_OLD_MODE;
                mode = IgnoreWhitespace;
                DEBUG_LOG_CHANGE_MODE;
            }

            if (node->implicit)
            {
                TY_(Report)(doc, body, node, INSERTING_TAG);
            }

            TY_(InsertNodeAtEnd)(body, node);
            
            {
                TidyParserMemory memory = {0};
                memory.identity = TY_(ParseBody);
                memory.original_node = body;
                memory.reentry_node = node;
                memory.register_1 = checkstack;
                memory.register_2 = iswhitenode;
                memory.mode = mode;
                TY_(pushMemory)( doc, memory );
            }
            DEBUG_LOG_EXIT_WITH_NODE(node);
            return node;
        }

        /* discard unexpected tags */
        TY_(Report)(doc, body, node, DISCARDING_UNEXPECTED);
        TY_(FreeNode)( doc, node);
    }
    DEBUG_LOG_EXIT;
    return NULL;
}